

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

grid_split * idx2::Split(grid_split *__return_storage_ptr__,grid *Grid,dimension D,int N)

{
  u64 uVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined8 local_25c;
  int local_254;
  undefined8 local_250;
  uint local_248;
  undefined8 local_240;
  v3i From3;
  v3i Mask3;
  undefined8 local_214;
  v3i Dims3;
  int N_local;
  dimension D_local;
  grid *Grid_local;
  undefined8 local_a4;
  undefined8 local_98;
  uint local_90;
  u64 local_88;
  undefined8 local_7c;
  undefined8 local_70;
  uint local_68;
  u64 local_60;
  undefined8 local_58;
  uint local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  uint local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 *local_10;
  
  local_60 = (Grid->super_extent).Dims;
  local_44 = ((int)local_60 << 0xb) >> 0xb;
  local_48 = (int)((long)(local_60 << 0x16) >> 0x2b);
  uVar3 = (uint)((long)(local_60 * 2) >> 0x2b);
  local_58._0_4_ = local_44;
  local_58._4_4_ = local_48;
  uVar2 = local_58;
  local_70 = uVar2;
  local_214 = uVar2;
  (__return_storage_ptr__->First).super_extent.From = (Grid->super_extent).From;
  (__return_storage_ptr__->First).super_extent.Dims = (Grid->super_extent).Dims;
  (__return_storage_ptr__->First).Strd = Grid->Strd;
  (__return_storage_ptr__->Second).super_extent.From = (Grid->super_extent).From;
  (__return_storage_ptr__->Second).super_extent.Dims = (Grid->super_extent).Dims;
  (__return_storage_ptr__->Second).Strd = Grid->Strd;
  From3.field_0._4_8_ = uVar2;
  Dims3.field_0.field_0.X = uVar3;
  Dims3.field_0.field_0.Y = N;
  Dims3.field_0.field_0.Z = D;
  local_68 = uVar3;
  local_4c = uVar3;
  local_40 = &local_58;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&From3.field_0 + (long)(int)D * 4 + 4) = N;
  From3.field_0.field_0.Y = (int)uVar2;
  From3.field_0.field_0.Z = (int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->First).super_extent.Dims =
       (long)(int)(From3.field_0.field_0.Y & 0x1fffff) +
       (long)(int)(From3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
       ((long)(int)(uVar3 & 0x1fffff) << 0x2a);
  From3.field_0._4_8_ = uVar2;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&From3.field_0 + (long)(int)D * 4 + 4) =
       *(int *)((long)&local_214 + (long)(int)D * 4) - N;
  (__return_storage_ptr__->Second).super_extent.Dims =
       (ulong)(From3.field_0.field_0.Y & 0x1fffff) |
       (ulong)(From3.field_0.field_0.Z & 0x1fffff) << 0x15 | (ulong)(uVar3 & 0x1fffff) << 0x2a;
  local_88 = (Grid->super_extent).From;
  local_2c = ((int)local_88 << 0xb) >> 0xb;
  local_28 = &local_7c;
  local_30 = (int)((long)(local_88 << 0x16) >> 0x2b);
  local_248 = (uint)((long)(local_88 * 2) >> 0x2b);
  local_7c._0_4_ = local_2c;
  local_7c._4_4_ = local_30;
  local_98 = local_7c;
  local_250 = local_7c;
  local_240 = local_7c;
  uVar1 = Grid->Strd;
  local_14 = ((int)uVar1 << 0xb) >> 0xb;
  local_10 = &local_a4;
  local_18 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  local_254 = (int)((long)(uVar1 * 2) >> 0x2b);
  local_a4._0_4_ = local_14;
  local_a4._4_4_ = local_18;
  local_25c = local_a4;
  From3.field_0.field_0.X = local_248;
  local_90 = local_248;
  local_34 = local_248;
  local_1c = local_254;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&local_240 + (long)(int)D * 4) =
       N * *(int *)((long)&local_25c + (long)(int)D * 4) +
       *(int *)((long)&local_240 + (long)(int)D * 4);
  local_240._0_4_ = (uint)local_7c;
  local_240._4_4_ = (uint)((ulong)local_7c >> 0x20);
  (__return_storage_ptr__->Second).super_extent.From =
       (long)(int)((uint)local_240 & 0x1fffff) + (long)(int)(local_240._4_4_ & 0x1fffff) * 0x200000
       + ((long)(int)(local_248 & 0x1fffff) << 0x2a);
  return __return_storage_ptr__;
}

Assistant:

grid_split
Split(const grid& Grid, dimension D, int N)
{
  v3i Dims3 = Dims(Grid);
  idx2_Assert(N <= Dims3[D] && N >= 0);
  grid_split GridSplit{ Grid, Grid };
  v3i Mask3 = Dims3;
  Mask3[D] = N;
  SetDims(&GridSplit.First, Mask3);
  Mask3[D] = Dims3[D] - N;
  SetDims(&GridSplit.Second, Mask3);
  v3i From3 = From(Grid);
  From3[D] += N * Strd(Grid)[D];
  SetFrom(&GridSplit.Second, From3);
  return GridSplit;
}